

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined4 uVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar5;
  undefined1 (*pauVar6) [16];
  int *piVar7;
  size_t sVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  range<unsigned_int> *current_00;
  ulong uVar12;
  ulong uVar13;
  range<unsigned_int> rVar14;
  uint uVar15;
  ulong uVar16;
  range<unsigned_int> rVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  MutexSys *local_270;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_268;
  ThreadLocal2 *local_250;
  undefined1 local_248 [16];
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_228;
  range<unsigned_int> local_1f8 [8];
  MutexSys *local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  MutexSys local_1a8;
  int iStack_19c;
  undefined8 local_198 [45];
  undefined1 auVar24 [64];
  undefined1 auVar27 [64];
  
  local_268._8_8_ = local_268._0_8_;
  this_01 = alloc.alloc;
  pTVar5 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar9 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar9 + 1) = 1;
    puVar9[2] = puVar9 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 2),local_1b8,
               (long)&local_1b8->mutex + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar9,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar19 = (this->super_Settings).maxLeafSize;
  local_230 = __return_storage_ptr__;
  if (uVar19 < current->_end - current->_begin) {
    local_248._8_8_ = local_248._0_8_;
    local_248._0_8_ = depth;
    local_1f8[0] = *current;
    uVar10 = (this->super_Settings).branchingFactor;
    uVar21 = 1;
    do {
      if (uVar21 == 0) {
        uVar11 = 0xffffffffffffffff;
      }
      else {
        uVar12 = 0;
        uVar16 = 0;
        uVar13 = 0xffffffffffffffff;
        do {
          uVar18 = (ulong)(local_1f8[uVar12]._end - local_1f8[uVar12]._begin);
          uVar11 = uVar12;
          if (uVar18 <= uVar19 || uVar18 <= uVar16) {
            uVar11 = uVar13;
            uVar18 = uVar16;
          }
          uVar16 = uVar18;
          uVar12 = uVar12 + 1;
          uVar13 = uVar11;
        } while (uVar21 != uVar12);
      }
      if (uVar11 == 0xffffffffffffffff) break;
      uVar15 = local_1f8[uVar11]._end + local_1f8[uVar11]._begin >> 1;
      rVar14._end = local_1f8[uVar11]._end;
      rVar14._begin = uVar15;
      rVar17._end = uVar15;
      rVar17._begin = local_1f8[uVar11]._begin;
      local_1f8[uVar11] = local_1f8[uVar21 - 1];
      local_1f8[uVar21 - 1] = rVar17;
      local_1f8[uVar21] = rVar14;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar10);
    local_270 = (MutexSys *)0x80;
    this_00 = (alloc.talloc0)->parent;
    if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
      local_228._8_1_ = '\x01';
      local_228.ref.ptr = (size_t)this_00;
      MutexSys::lock(&this_00->mutex);
      if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((this_00->alloc0).end + (this_00->alloc1).end) -
             ((this_00->alloc0).cur + (this_00->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_00->alloc0).end = auVar22._0_8_;
      (this_00->alloc0).allocBlockSize = auVar22._8_8_;
      (this_00->alloc0).bytesUsed = auVar22._16_8_;
      (this_00->alloc0).bytesWasted = auVar22._24_8_;
      (this_00->alloc0).ptr = (char *)auVar22._0_8_;
      (this_00->alloc0).cur = auVar22._8_8_;
      (this_00->alloc0).end = auVar22._16_8_;
      (this_00->alloc0).allocBlockSize = auVar22._24_8_;
      auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
      if (this_01 == (FastAllocator *)0x0) {
        (this_00->alloc1).end = auVar22._0_8_;
        (this_00->alloc1).allocBlockSize = auVar22._8_8_;
        (this_00->alloc1).bytesUsed = auVar22._16_8_;
        (this_00->alloc1).bytesWasted = auVar22._24_8_;
        (this_00->alloc1).ptr = (char *)auVar22._0_8_;
        (this_00->alloc1).cur = auVar22._8_8_;
        (this_00->alloc1).end = auVar22._16_8_;
        (this_00->alloc1).allocBlockSize = auVar22._24_8_;
      }
      else {
        (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
        (this_00->alloc1).ptr = (char *)auVar22._0_8_;
        (this_00->alloc1).cur = auVar22._8_8_;
        (this_00->alloc1).end = auVar22._16_8_;
        (this_00->alloc1).allocBlockSize = auVar22._24_8_;
        (this_00->alloc1).end = auVar22._0_8_;
        (this_00->alloc1).allocBlockSize = auVar22._8_8_;
        (this_00->alloc1).bytesUsed = auVar22._16_8_;
        (this_00->alloc1).bytesWasted = auVar22._24_8_;
        (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
      }
      LOCK();
      (this_00->alloc)._M_b._M_p = this_01;
      UNLOCK();
      local_1b8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      local_1b0 = '\x01';
      local_250 = this_00;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      __position._M_current =
           (this_01->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_01->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&this_01->thread_local_allocators,__position,&local_250);
      }
      else {
        *__position._M_current = local_250;
        pppTVar2 = &(this_01->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (local_1b0 == '\x01') {
        MutexSys::unlock(local_1b8);
      }
      if (local_228._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_228.ref.ptr);
      }
    }
    pTVar5->bytesUsed = (long)&local_270->mutex + pTVar5->bytesUsed;
    sVar8 = pTVar5->cur;
    uVar19 = (ulong)(-(int)sVar8 & 0xf);
    uVar10 = (long)&local_270->mutex + uVar19 + sVar8;
    pTVar5->cur = uVar10;
    if (pTVar5->end < uVar10) {
      pTVar5->cur = sVar8;
      if ((MutexSys *)pTVar5->allocBlockSize < (MutexSys *)((long)local_270 << 2)) {
        pcVar20 = (char *)FastAllocator::malloc(this_01,(size_t)&local_270);
      }
      else {
        local_1b8 = (MutexSys *)pTVar5->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar5->ptr = pcVar20;
        sVar8 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar8;
        pTVar5->cur = 0;
        pTVar5->end = (size_t)local_1b8;
        pTVar5->cur = (size_t)local_270;
        if (local_1b8 < local_270) {
          pTVar5->cur = 0;
          local_1b8 = (MutexSys *)pTVar5->allocBlockSize;
          local_268._0_8_ = this;
          pcVar20 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
          pTVar5->ptr = pcVar20;
          sVar8 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
          pTVar5->bytesWasted = sVar8;
          pTVar5->cur = 0;
          pTVar5->end = (size_t)local_1b8;
          pTVar5->cur = (size_t)local_270;
          this = (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
                  *)local_268._0_8_;
          if (local_1b8 < local_270) {
            pTVar5->cur = 0;
            pcVar20 = (char *)0x0;
          }
          else {
            pTVar5->bytesWasted = sVar8;
          }
        }
        else {
          pTVar5->bytesWasted = sVar8;
        }
      }
    }
    else {
      pTVar5->bytesWasted = pTVar5->bytesWasted + uVar19;
      pcVar20 = pTVar5->ptr + (uVar10 - (long)local_270);
    }
    auVar23._8_4_ = 0x7f800000;
    auVar23._0_8_ = 0x7f8000007f800000;
    auVar23._12_4_ = 0x7f800000;
    auVar24 = ZEXT1664(auVar23);
    *(undefined1 (*) [16])(pcVar20 + 0x60) = auVar23;
    *(undefined1 (*) [16])(pcVar20 + 0x40) = auVar23;
    *(undefined1 (*) [16])(pcVar20 + 0x20) = auVar23;
    auVar25._8_4_ = 0xff800000;
    auVar25._0_8_ = 0xff800000ff800000;
    auVar25._12_4_ = 0xff800000;
    auVar27 = ZEXT1664(auVar25);
    *(undefined1 (*) [16])(pcVar20 + 0x70) = auVar25;
    *(undefined1 (*) [16])(pcVar20 + 0x50) = auVar25;
    *(undefined1 (*) [16])(pcVar20 + 0x30) = auVar25;
    pcVar20[0] = '\b';
    pcVar20[1] = '\0';
    pcVar20[2] = '\0';
    pcVar20[3] = '\0';
    pcVar20[4] = '\0';
    pcVar20[5] = '\0';
    pcVar20[6] = '\0';
    pcVar20[7] = '\0';
    pcVar20[8] = '\b';
    pcVar20[9] = '\0';
    pcVar20[10] = '\0';
    pcVar20[0xb] = '\0';
    pcVar20[0xc] = '\0';
    pcVar20[0xd] = '\0';
    pcVar20[0xe] = '\0';
    pcVar20[0xf] = '\0';
    pcVar20[0x10] = '\b';
    pcVar20[0x11] = '\0';
    pcVar20[0x12] = '\0';
    pcVar20[0x13] = '\0';
    pcVar20[0x14] = '\0';
    pcVar20[0x15] = '\0';
    pcVar20[0x16] = '\0';
    pcVar20[0x17] = '\0';
    pcVar20[0x18] = '\b';
    pcVar20[0x19] = '\0';
    pcVar20[0x1a] = '\0';
    pcVar20[0x1b] = '\0';
    pcVar20[0x1c] = '\0';
    pcVar20[0x1d] = '\0';
    pcVar20[0x1e] = '\0';
    pcVar20[0x1f] = '\0';
    if (uVar21 != 0) {
      local_248._0_8_ = local_248._0_8_ + 1;
      current_00 = local_1f8;
      puVar9 = local_198;
      local_268._0_8_ = this;
      uVar19 = uVar21;
      do {
        alloc_00.talloc0 = alloc.talloc0;
        alloc_00.alloc = alloc.alloc;
        alloc_00.talloc1 = alloc.talloc1;
        createLargeLeaf(&local_228,
                        (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
                         *)local_268._0_8_,local_248._0_8_,current_00,alloc_00);
        puVar9[-4] = local_228.ref.ptr;
        puVar9[-2] = local_228.bounds.lower.field_0._0_8_;
        puVar9[-1] = local_228.bounds.lower.field_0._8_8_;
        *puVar9 = local_228.bounds.upper.field_0._0_8_;
        puVar9[1] = local_228.bounds.upper.field_0._8_8_;
        puVar9 = puVar9 + 6;
        current_00 = current_00 + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
      auVar24 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar27 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      pauVar6 = (undefined1 (*) [16])local_198;
      uVar19 = 0;
      do {
        auVar23 = pauVar6[-1];
        auVar25 = *pauVar6;
        *(undefined8 *)(pcVar20 + uVar19 * 8) = *(undefined8 *)pauVar6[-2];
        *(int *)(pcVar20 + uVar19 * 4 + 0x20) = auVar23._0_4_;
        uVar3 = vextractps_avx(auVar23,1);
        *(undefined4 *)(pcVar20 + uVar19 * 4 + 0x40) = uVar3;
        uVar3 = vextractps_avx(auVar23,2);
        *(undefined4 *)(pcVar20 + uVar19 * 4 + 0x60) = uVar3;
        *(int *)(pcVar20 + uVar19 * 4 + 0x30) = auVar25._0_4_;
        uVar3 = vextractps_avx(auVar25,1);
        *(undefined4 *)(pcVar20 + uVar19 * 4 + 0x50) = uVar3;
        auVar23 = vminps_avx(auVar24._0_16_,auVar23);
        auVar24 = ZEXT1664(auVar23);
        uVar3 = vextractps_avx(auVar25,2);
        *(undefined4 *)(pcVar20 + uVar19 * 4 + 0x70) = uVar3;
        auVar23 = vmaxps_avx(auVar27._0_16_,auVar25);
        auVar27 = ZEXT1664(auVar23);
        uVar19 = uVar19 + 1;
        pauVar6 = pauVar6 + 3;
      } while (uVar21 != uVar19);
    }
    aVar26 = auVar27._0_16_;
    auVar23 = auVar24._0_16_;
    if (uVar21 == 0) {
      uVar19 = 0;
    }
    else {
      piVar7 = &iStack_19c;
      uVar19 = 0;
      uVar10 = uVar21;
      do {
        uVar19 = uVar19 + (long)*piVar7;
        piVar7 = piVar7 + 0xc;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    if ((0xfff < uVar19) && (uVar21 != 0)) {
      piVar7 = &iStack_19c;
      uVar10 = 0;
      local_268 = aVar26;
      local_248 = auVar23;
      do {
        if (*piVar7 < 0x1000) {
          BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar20 + uVar10 * 8),1);
          auVar27 = ZEXT1664((undefined1  [16])local_268);
          auVar24 = ZEXT1664(local_248);
          pcVar20[uVar10 * 8 + 7] = pcVar20[uVar10 * 8 + 7] | 0x80;
        }
        aVar26 = auVar27._0_16_;
        auVar23 = auVar24._0_16_;
        uVar10 = uVar10 + 1;
        piVar7 = piVar7 + 0xc;
      } while (uVar21 != uVar10);
    }
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar23,ZEXT416((uint)uVar19),0x30)
    ;
    (local_230->ref).ptr = (size_t)pcVar20;
    (local_230->bounds).lower.field_0 = aVar4;
    (local_230->bounds).upper.field_0 = aVar26;
  }
  else {
    CreateMortonLeaf<4,_embree::Object>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
  }
  return local_230;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }